

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteToConsoleListener.cpp
# Opt level: O0

shared_ptr<Common::WriteToConsoleListener> Common::WriteToConsoleListener::instance(void)

{
  int iVar1;
  WriteToConsoleListener *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<Common::WriteToConsoleListener> sVar2;
  
  if (instance()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&instance()::inst);
    if (iVar1 != 0) {
      this = (WriteToConsoleListener *)operator_new(0x30);
      WriteToConsoleListener(this);
      std::shared_ptr<Common::WriteToConsoleListener>::
      shared_ptr<Common::WriteToConsoleListener,void>(&instance::inst,this);
      __cxa_atexit(std::shared_ptr<Common::WriteToConsoleListener>::~shared_ptr,&instance::inst,
                   &__dso_handle);
      __cxa_guard_release(&instance()::inst);
    }
  }
  std::shared_ptr<Common::WriteToConsoleListener>::shared_ptr
            ((shared_ptr<Common::WriteToConsoleListener> *)in_RDI,&instance::inst);
  sVar2.super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<Common::WriteToConsoleListener>)
         sVar2.super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<WriteToConsoleListener> WriteToConsoleListener::instance()
{
    static auto inst = std::shared_ptr<WriteToConsoleListener>(new WriteToConsoleListener);
    return inst;
}